

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

void Split_Cubic(TPoint *base)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  base[6].x = base[3].x;
  lVar1 = base[1].y;
  lVar3 = base->x + base[1].x;
  lVar2 = base[1].x + base[2].x;
  lVar4 = base[2].x + base[3].x;
  base[5].x = lVar4 >> 1;
  lVar4 = lVar4 + lVar2;
  lVar2 = lVar2 + lVar3;
  base[4].x = lVar4 >> 2;
  base[1].x = lVar3 >> 1;
  base[2].x = lVar2 >> 2;
  base[3].x = lVar2 + lVar4 >> 3;
  base[6].y = base[3].y;
  lVar2 = base->y + lVar1;
  lVar1 = lVar1 + base[2].y;
  lVar3 = base[2].y + base[3].y;
  base[5].y = lVar3 >> 1;
  lVar3 = lVar3 + lVar1;
  lVar1 = lVar1 + lVar2;
  base[4].y = lVar3 >> 2;
  base[1].y = lVar2 >> 1;
  base[2].y = lVar1 >> 2;
  base[3].y = lVar1 + lVar3 >> 3;
  return;
}

Assistant:

static void
  Split_Cubic( TPoint*  base )
  {
    Long  a, b, c;


    base[6].x = base[3].x;
    a = base[0].x + base[1].x;
    b = base[1].x + base[2].x;
    c = base[2].x + base[3].x;
    base[5].x = c >> 1;
    c += b;
    base[4].x = c >> 2;
    base[1].x = a >> 1;
    a += b;
    base[2].x = a >> 2;
    base[3].x = ( a + c ) >> 3;

    base[6].y = base[3].y;
    a = base[0].y + base[1].y;
    b = base[1].y + base[2].y;
    c = base[2].y + base[3].y;
    base[5].y = c >> 1;
    c += b;
    base[4].y = c >> 2;
    base[1].y = a >> 1;
    a += b;
    base[2].y = a >> 2;
    base[3].y = ( a + c ) >> 3;
  }